

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O0

void asio::detail::executor_function::
     complete<asio::detail::binder1<helics::MessageTimer::addTimer(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::__0,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  byte in_SIL;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
  function;
  ptr p;
  allocator<void> allocator;
  impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>,_std::allocator<void>_>
  *i;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
  *in_stack_ffffffffffffff88;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
  *in_stack_ffffffffffffff90;
  
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>
  ::binder1(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset((ptr *)in_stack_ffffffffffffff90);
  if ((in_SIL & 1) != 0) {
    binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>
    ::operator()((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
                  *)0x6a654c);
  }
  binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>
  ::~binder1((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
              *)0x6a6584);
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr((ptr *)0x6a658e);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }